

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 DateFormat(jx9_context *pCtx,char *zIn,int nLen,Sytm *pTm)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar5;
  int local_6c;
  uint local_60;
  uint local_5c;
  ulong local_50;
  time_t tt;
  uint local_40;
  int v;
  int isLeap;
  int nDays;
  char *zCur;
  char *zEnd;
  Sytm *pTm_local;
  char *pcStack_18;
  int nLen_local;
  char *zIn_local;
  jx9_context *pCtx_local;
  
  zCur = zIn + nLen;
  zEnd = (char *)pTm;
  pTm_local._4_4_ = nLen;
  zIn_local = (char *)pCtx;
  for (pcStack_18 = zIn; pcVar4 = zIn_local,
      uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20), pcStack_18 < zCur;
      pcStack_18 = pcStack_18 + 1) {
    switch(*pcStack_18) {
    case 'A':
      pcVar4 = "AM";
      if (0xc < *(int *)(zEnd + 8)) {
        pcVar4 = "PM";
      }
      jx9_result_string((jx9_context *)zIn_local,pcVar4,2);
      break;
    default:
      jx9_result_string((jx9_context *)zIn_local,pcStack_18,1);
      break;
    case 'D':
      _isLeap = SyTimeGetDay(*(sxi32 *)(zEnd + 0x18));
      jx9_result_string((jx9_context *)zIn_local,_isLeap,3);
      break;
    case 'F':
      _isLeap = SyTimeGetMonth(*(sxi32 *)(zEnd + 0x10));
      jx9_result_string((jx9_context *)zIn_local,_isLeap,-1);
      break;
    case 'G':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)*(uint *)(zEnd + 8));
      break;
    case 'H':
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)(zEnd + 8));
      break;
    case 'I':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)(*(int *)(zEnd + 0x20) == 1));
      break;
    case 'L':
      if (*(int *)(zEnd + 0x14) % 400 == 0) {
        local_60 = 1;
      }
      else {
        if (*(int *)(zEnd + 0x14) % 100 == 0) {
          local_5c = 0;
        }
        else {
          local_5c = (uint)(*(int *)(zEnd + 0x14) % 4 == 0);
        }
        local_60 = local_5c;
      }
      local_40 = local_60;
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)local_60);
      break;
    case 'M':
      _isLeap = SyTimeGetMonth(*(sxi32 *)(zEnd + 0x10));
      jx9_result_string((jx9_context *)zIn_local,_isLeap,3);
      break;
    case 'N':
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%d",(ulong)(uint)aISO8601[*(int *)(zEnd + 0x18) % 7]);
      break;
    case 'O':
    case 'P':
      jx9_result_string_format((jx9_context *)zIn_local,"%+05d",*(undefined8 *)(zEnd + 0x30));
      break;
    case 'S':
      tt._4_4_ = *(int *)(zEnd + 0xc);
      if ((int)((long)((ulong)(uint)((int)((long)tt._4_4_ / 10) >> 0x1f) << 0x20 |
                      (long)tt._4_4_ / 10 & 0xffffffffU) % 10) == 1) {
        local_6c = 0;
      }
      else {
        local_6c = tt._4_4_ % 10;
      }
      jx9_result_string((jx9_context *)zIn_local,"thstndrdthththththth" + (local_6c << 1),2);
      break;
    case 'U':
      time((time_t *)&local_50);
      jx9_result_string_format((jx9_context *)zIn_local,"%u",local_50 & 0xffffffff);
      break;
    case 'Y':
      jx9_result_string_format((jx9_context *)zIn_local,"%4d",(ulong)*(uint *)(zEnd + 0x14));
      break;
    case 'Z':
      jx9_result_string_format((jx9_context *)zIn_local,"%+05d",*(undefined8 *)(zEnd + 0x30));
      break;
    case '\\':
      pcStack_18 = pcStack_18 + 1;
      if (pcStack_18 < zCur) {
        jx9_result_string((jx9_context *)zIn_local,pcStack_18,1);
      }
      break;
    case 'a':
      pcVar4 = "am";
      if (0xc < *(int *)(zEnd + 8)) {
        pcVar4 = "pm";
      }
      jx9_result_string((jx9_context *)zIn_local,pcVar4,2);
      break;
    case 'c':
      in_stack_ffffffffffffff78 = *(undefined8 *)(zEnd + 0x30);
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%4d-%02d-%02dT%02d:%02d:%02d%+05d",
                 (ulong)*(uint *)(zEnd + 0x14),(ulong)(*(int *)(zEnd + 0x10) + 1),
                 (ulong)*(uint *)(zEnd + 0xc),(ulong)*(uint *)(zEnd + 8),*(undefined4 *)(zEnd + 4),
                 *(undefined4 *)zEnd,in_stack_ffffffffffffff78);
      break;
    case 'd':
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)(zEnd + 0xc));
      break;
    case 'e':
      _isLeap = *(char **)(zEnd + 0x28);
      if (_isLeap == (char *)0x0) {
        _isLeap = "GMT";
      }
      jx9_result_string((jx9_context *)zIn_local,_isLeap,-1);
      break;
    case 'g':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)(*(int *)(zEnd + 8) % 0xc + 1));
      break;
    case 'h':
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d",(ulong)(*(int *)(zEnd + 8) % 0xc + 1));
      break;
    case 'i':
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)(zEnd + 4));
      break;
    case 'j':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)*(uint *)(zEnd + 0xc));
      break;
    case 'l':
      _isLeap = SyTimeGetDay(*(sxi32 *)(zEnd + 0x18));
      jx9_result_string((jx9_context *)zIn_local,_isLeap,-1);
      break;
    case 'm':
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)(*(int *)(zEnd + 0x10) + 1));
      break;
    case 'n':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)(*(int *)(zEnd + 0x10) + 1));
      break;
    case 'o':
      jx9_result_string_format((jx9_context *)zIn_local,"%4d",(ulong)*(uint *)(zEnd + 0x14));
      break;
    case 'r':
      pcVar2 = SyTimeGetDay(*(sxi32 *)(zEnd + 0x18));
      uVar1 = *(uint *)(zEnd + 0xc);
      pcVar3 = SyTimeGetMonth(*(sxi32 *)(zEnd + 0x10));
      in_stack_ffffffffffffff78 = CONCAT44(uVar5,*(undefined4 *)zEnd);
      jx9_result_string_format
                ((jx9_context *)pcVar4,"%.3s, %02d %.3s %4d %02d:%02d:%02d",pcVar2,(ulong)uVar1,
                 pcVar3,(ulong)*(uint *)(zEnd + 0x14),*(undefined4 *)(zEnd + 8),
                 *(undefined4 *)(zEnd + 4),in_stack_ffffffffffffff78);
      break;
    case 's':
      jx9_result_string_format((jx9_context *)zIn_local,"%02d",(ulong)*(uint *)zEnd);
      break;
    case 't':
      v = DateFormat::aMonDays[*(int *)(zEnd + 0x10) % 0xc];
      if (((*(int *)(zEnd + 0x10) == 1) && (*(int *)(zEnd + 0x14) % 400 != 0)) &&
         ((*(int *)(zEnd + 0x14) % 100 == 0 || (*(int *)(zEnd + 0x14) % 4 != 0)))) {
        v = 0x1c;
      }
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)(uint)v);
      break;
    case 'u':
      jx9_result_string_format((jx9_context *)zIn_local,"%u",(ulong)(uint)(*(int *)zEnd * 1000000));
      break;
    case 'w':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)*(uint *)(zEnd + 0x18));
      break;
    case 'y':
      jx9_result_string_format
                ((jx9_context *)zIn_local,"%02d",(long)*(int *)(zEnd + 0x14) % 100 & 0xffffffff);
      break;
    case 'z':
      jx9_result_string_format((jx9_context *)zIn_local,"%d",(ulong)*(uint *)(zEnd + 0x1c));
    }
  }
  return 0;
}

Assistant:

static sxi32 DateFormat(jx9_context *pCtx, const char *zIn, int nLen, Sytm *pTm)
{
	const char *zEnd = &zIn[nLen];
	const char *zCur;
	/* Start the format process */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		switch(zIn[0]){
		case 'd':
			/* Day of the month, 2 digits with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mday);
			break;
		case 'D':
			/*A textual representation of a day, three letters*/
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'j':
			/*	Day of the month without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_mday);
			break;
		case 'l':
			/* A full textual representation of the day of the week */
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'N':{
			/* ISO-8601 numeric representation of the day of the week */
			jx9_result_string_format(pCtx, "%d", aISO8601[pTm->tm_wday % 7 ]);
			break;
				 }
		case 'w':
			/*Numeric representation of the day of the week*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_wday);
			break;
		case 'z':
			/*The day of the year*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_yday);
			break;
		case 'F':
			/*A full textual representation of a month, such as January or March*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'm':
			/*Numeric representation of a month, with leading zeros*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mon + 1);
			break;
		case 'M':
			/*A short textual representation of a month, three letters*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'n':
			/*Numeric representation of a month, without leading zeros*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_mon + 1);
			break;
		case 't':{
			static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
			int nDays = aMonDays[pTm->tm_mon % 12 ];
			if( pTm->tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(pTm->tm_year) ){
				nDays = 28;
			}
			/*Number of days in the given month*/
			jx9_result_string_format(pCtx, "%d", nDays);
			break;
				 }
		case 'L':{
			int isLeap = IS_LEAP_YEAR(pTm->tm_year);
			/* Whether it's a leap year */
			jx9_result_string_format(pCtx, "%d", isLeap);
			break;
				 }
		case 'o':
			/* ISO-8601 year number.*/
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'Y':
			/*	A full numeric representation of a year, 4 digits */
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'y':
			/*A two digit representation of a year*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_year%100);
			break;
		case 'a':
			/*	Lowercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "pm" : "am", 2);
			break;
		case 'A':
			/*	Uppercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "PM" : "AM", 2);
			break;
		case 'g':
			/*	12-hour format of an hour without leading zeros*/
			jx9_result_string_format(pCtx, "%d", 1+(pTm->tm_hour%12));
			break;
		case 'G':
			/* 24-hour format of an hour without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_hour);
			break;
		case 'h':
			/* 12-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", 1+(pTm->tm_hour%12));
			break;
		case 'H':
			/*	24-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_hour);
			break;
		case 'i':
			/* 	Minutes with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_min);
			break;
		case 's':
			/* 	second with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_sec);
			break;
		case 'u':
			/* 	Microseconds */
			jx9_result_string_format(pCtx, "%u", pTm->tm_sec * SX_USEC_PER_SEC);
			break;
		case 'S':{
			/* English ordinal suffix for the day of the month, 2 characters */
			static const char zSuffix[] = "thstndrdthththththth";
			int v = pTm->tm_mday;
			jx9_result_string(pCtx, &zSuffix[2 * (int)(v / 10 % 10 != 1 ? v % 10 : 0)], (int)sizeof(char) * 2);
			break;
				 }
		case 'e':
			/* 	Timezone identifier */
			zCur = pTm->tm_zone;
			if( zCur == 0 ){
				/* Assume GMT */
				zCur = "GMT";
			}
			jx9_result_string(pCtx, zCur, -1);
			break;
		case 'I':
			/* Whether or not the date is in daylight saving time */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&pTm->tm_isdst);
#endif
#endif
#endif
			jx9_result_string_format(pCtx, "%d", pTm->tm_isdst == 1);
			break;
		case 'r':
			/* RFC 2822 formatted date 	Example: Thu, 21 Dec 2000 16:01:07 */
			jx9_result_string_format(pCtx, "%.3s, %02d %.3s %4d %02d:%02d:%02d", 
				SyTimeGetDay(pTm->tm_wday), 
				pTm->tm_mday, 
				SyTimeGetMonth(pTm->tm_mon), 
				pTm->tm_year, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec
				);
			break;
		case 'U':{
			time_t tt;
			/* Seconds since the Unix Epoch */
			time(&tt);
			jx9_result_string_format(pCtx, "%u", (unsigned int)tt);
			break;
				 }
		case 'O':
		case 'P':
			/* Difference to Greenwich time (GMT) in hours */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'Z':
			/* Timezone offset in seconds. The offset for timezones west of UTC
			 * is always negative, and for those east of UTC is always positive.
			 */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'c':
			/* 	ISO 8601 date */
			jx9_result_string_format(pCtx, "%4d-%02d-%02dT%02d:%02d:%02d%+05d", 
				pTm->tm_year, 
				pTm->tm_mon+1, 
				pTm->tm_mday, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec, 
				pTm->tm_gmtoff
				);
			break;
		case '\\':
			zIn++;
			/* Expand verbatim */
			if( zIn < zEnd ){
				jx9_result_string(pCtx, zIn, (int)sizeof(char));
			}
			break;
		default:
			/* Unknown format specifer, expand verbatim */
			jx9_result_string(pCtx, zIn, (int)sizeof(char));
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	return SXRET_OK;
}